

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O1

string * __thiscall
t_cpp_generator::function_signature
          (string *__return_storage_ptr__,t_cpp_generator *this,t_function *tfunction,string *style,
          string *prefix,bool name_params)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  t_type *ttype;
  pointer pptVar2;
  pointer pptVar3;
  long lVar4;
  undefined4 uVar5;
  t_cpp_generator *ptVar6;
  bool bVar7;
  int iVar8;
  long *plVar9;
  undefined8 *puVar10;
  size_type *psVar11;
  long *plVar12;
  ulong *puVar13;
  char **ppcVar14;
  char *pcVar15;
  undefined8 uVar16;
  _Alloc_hider _Var17;
  undefined3 in_register_00000089;
  string cob_type;
  string exn_cob;
  long *local_1d8;
  long local_1d0;
  long local_1c8;
  long lStack_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1b8;
  undefined8 local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  undefined4 local_194;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  char **local_170;
  char *local_168;
  char *local_160;
  long lStack_158;
  string local_150;
  t_cpp_generator *local_130;
  t_struct *local_128;
  string *local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8;
  string local_d8;
  pointer local_b8;
  string local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_194 = CONCAT31(in_register_00000089,name_params);
  ttype = tfunction->returntype_;
  local_128 = tfunction->arglist_;
  pptVar2 = (tfunction->xceptions_->members_).
            super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pptVar3 = (tfunction->xceptions_->members_).
            super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_120 = prefix;
  iVar8 = std::__cxx11::string::compare((char *)style);
  if (iVar8 == 0) {
    bVar7 = is_complex_type(this,ttype);
    if (bVar7) {
      std::operator+(&local_118,"void ",local_120);
      plVar9 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_118,(ulong)(tfunction->name_)._M_dataplus._M_p);
      uVar5 = local_194;
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      psVar11 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_f8.field_2._M_allocated_capacity = *psVar11;
        local_f8.field_2._8_8_ = plVar9[3];
      }
      else {
        local_f8.field_2._M_allocated_capacity = *psVar11;
        local_f8._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_f8._M_string_length = plVar9[1];
      *plVar9 = (long)psVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
      paVar1 = &local_190.field_2;
      plVar9 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar9) {
        local_190.field_2._M_allocated_capacity = *plVar9;
        local_190.field_2._8_8_ = puVar10[3];
        local_190._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_190.field_2._M_allocated_capacity = *plVar9;
        local_190._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_190._M_string_length = puVar10[1];
      *puVar10 = plVar9;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      type_name_abi_cxx11_(&local_150,this,ttype,false,false);
      uVar16 = (char *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != paVar1) {
        uVar16 = local_190.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar16 < (char *)(local_150._M_string_length + local_190._M_string_length)) {
        uVar16 = (char *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          uVar16 = local_150.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar16 < (char *)(local_150._M_string_length + local_190._M_string_length))
        goto LAB_0019bb65;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_150,0,(char *)0x0,(ulong)local_190._M_dataplus._M_p);
      }
      else {
LAB_0019bb65:
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_190,(ulong)local_150._M_dataplus._M_p);
      }
      local_1d8 = &local_1c8;
      plVar9 = puVar10 + 2;
      if ((long *)*puVar10 == plVar9) {
        local_1c8 = *plVar9;
        lStack_1c0 = puVar10[3];
      }
      else {
        local_1c8 = *plVar9;
        local_1d8 = (long *)*puVar10;
      }
      local_1d0 = puVar10[1];
      *puVar10 = plVar9;
      puVar10[1] = 0;
      *(undefined1 *)plVar9 = 0;
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d8);
      ppcVar14 = (char **)(puVar10 + 2);
      if ((char **)*puVar10 == ppcVar14) {
        local_160 = *ppcVar14;
        lStack_158 = puVar10[3];
        local_170 = &local_160;
      }
      else {
        local_160 = *ppcVar14;
        local_170 = (char **)*puVar10;
      }
      local_168 = (char *)puVar10[1];
      *puVar10 = ppcVar14;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      argument_list_abi_cxx11_(&local_d8,this,local_128,SUB41(uVar5,0),true);
      pcVar15 = (char *)0xf;
      if (local_170 != &local_160) {
        pcVar15 = local_160;
      }
      if (pcVar15 < local_168 + local_d8._M_string_length) {
        uVar16 = (char *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          uVar16 = local_d8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar16 < local_168 + local_d8._M_string_length) goto LAB_0019be1d;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_170);
      }
      else {
LAB_0019be1d:
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_170,(ulong)local_d8._M_dataplus._M_p);
      }
      local_1b8 = &local_1a8;
      puVar13 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar13) {
        local_1a8._M_allocated_capacity = *puVar13;
        local_1a8._8_8_ = puVar10[3];
      }
      else {
        local_1a8._M_allocated_capacity = *puVar13;
        local_1b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar10;
      }
      local_1b0 = puVar10[1];
      *puVar10 = puVar13;
      puVar10[1] = 0;
      *(undefined1 *)puVar13 = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_1b8);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar11 = (size_type *)(plVar9 + 2);
      if ((size_type *)*plVar9 == psVar11) {
        lVar4 = plVar9[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar9;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
      }
      __return_storage_ptr__->_M_string_length = plVar9[1];
      *plVar9 = (long)psVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      if (local_1b8 != &local_1a8) {
        operator_delete(local_1b8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      if (local_170 != &local_160) {
        operator_delete(local_170);
      }
      if (local_1d8 != &local_1c8) {
        operator_delete(local_1d8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != paVar1) {
LAB_0019bf32:
        operator_delete(local_190._M_dataplus._M_p);
      }
    }
    else {
      type_name_abi_cxx11_(&local_118,this,ttype,false,false);
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      psVar11 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_f8.field_2._M_allocated_capacity = *psVar11;
        local_f8.field_2._8_8_ = puVar10[3];
      }
      else {
        local_f8.field_2._M_allocated_capacity = *psVar11;
        local_f8._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_f8._M_string_length = puVar10[1];
      *puVar10 = psVar11;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      puVar10 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_f8,(ulong)(local_120->_M_dataplus)._M_p);
      plVar9 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar9) {
        local_190.field_2._M_allocated_capacity = *plVar9;
        local_190.field_2._8_8_ = puVar10[3];
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      }
      else {
        local_190.field_2._M_allocated_capacity = *plVar9;
        local_190._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_190._M_string_length = puVar10[1];
      *puVar10 = plVar9;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      puVar10 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_190,(ulong)(tfunction->name_)._M_dataplus._M_p);
      plVar9 = puVar10 + 2;
      if ((long *)*puVar10 == plVar9) {
        local_1c8 = *plVar9;
        lStack_1c0 = puVar10[3];
        local_1d8 = &local_1c8;
      }
      else {
        local_1c8 = *plVar9;
        local_1d8 = (long *)*puVar10;
      }
      local_1d0 = puVar10[1];
      *puVar10 = plVar9;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_1d8);
      ppcVar14 = (char **)(plVar9 + 2);
      if ((char **)*plVar9 == ppcVar14) {
        local_160 = *ppcVar14;
        lStack_158 = plVar9[3];
        local_170 = &local_160;
      }
      else {
        local_160 = *ppcVar14;
        local_170 = (char **)*plVar9;
      }
      local_168 = (char *)plVar9[1];
      *plVar9 = (long)ppcVar14;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      argument_list_abi_cxx11_(&local_150,this,local_128,local_194._0_1_,false);
      pcVar15 = (char *)0xf;
      if (local_170 != &local_160) {
        pcVar15 = local_160;
      }
      if (pcVar15 < local_168 + local_150._M_string_length) {
        uVar16 = (char *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          uVar16 = local_150.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar16 < local_168 + local_150._M_string_length) goto LAB_0019bcca;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_150,0,(char *)0x0,(ulong)local_170);
      }
      else {
LAB_0019bcca:
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_170,(ulong)local_150._M_dataplus._M_p);
      }
      local_1b8 = &local_1a8;
      puVar13 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar13) {
        local_1a8._M_allocated_capacity = *puVar13;
        local_1a8._8_8_ = puVar10[3];
      }
      else {
        local_1a8._M_allocated_capacity = *puVar13;
        local_1b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar10;
      }
      local_1b0 = puVar10[1];
      *puVar10 = puVar13;
      puVar10[1] = 0;
      *(undefined1 *)puVar13 = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_1b8);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar11 = (size_type *)(plVar9 + 2);
      if ((size_type *)*plVar9 == psVar11) {
        lVar4 = plVar9[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar9;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
      }
      __return_storage_ptr__->_M_string_length = plVar9[1];
      *plVar9 = (long)psVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      if (local_1b8 != &local_1a8) {
        operator_delete(local_1b8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p);
      }
      if (local_170 != &local_160) {
        operator_delete(local_170);
      }
      if (local_1d8 != &local_1c8) {
        operator_delete(local_1d8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) goto LAB_0019bf32;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    _Var17._M_p = local_118._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p == &local_118.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_0019ba01;
  }
  local_130 = this;
  local_b8 = pptVar2;
  std::__cxx11::string::substr((ulong)&local_1b8,(ulong)style);
  iVar8 = std::__cxx11::string::compare((char *)&local_1b8);
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8);
  }
  if (iVar8 != 0) {
    puVar10 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar10 = "UNKNOWN STYLE";
    __cxa_throw(puVar10,&char_const*::typeinfo,0);
  }
  local_1b0 = 0;
  local_1a8._M_allocated_capacity = local_1a8._M_allocated_capacity & 0xffffffffffffff00;
  local_168 = (char *)0x0;
  local_160 = (char *)((ulong)local_160 & 0xffffffffffffff00);
  local_1b8 = &local_1a8;
  local_170 = &local_160;
  iVar8 = std::__cxx11::string::compare((char *)style);
  ptVar6 = local_130;
  if (iVar8 == 0) {
    std::operator+(&local_190,"(",
                   &(local_130->super_t_oop_generator).super_t_generator.service_name_);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_190);
    plVar12 = plVar9 + 2;
    if ((long *)*plVar9 == plVar12) {
      local_1c8 = *plVar12;
      lStack_1c0 = plVar9[3];
      local_1d8 = &local_1c8;
    }
    else {
      local_1c8 = *plVar12;
      local_1d8 = (long *)*plVar9;
    }
    local_1d0 = plVar9[1];
    *plVar9 = (long)plVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1b8,(string *)&local_1d8);
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p);
    }
    if (ptVar6->gen_templates_ == true) {
      std::__cxx11::string::append((char *)&local_1b8);
    }
    std::__cxx11::string::append((char *)&local_1b8);
  }
  else {
    iVar8 = std::__cxx11::string::compare((char *)style);
    if (iVar8 != 0) {
      puVar10 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar10 = "UNKNOWN STYLE";
      __cxa_throw(puVar10,&char_const*::typeinfo,0);
    }
    iVar8 = (*(ttype->super_t_doc)._vptr_t_doc[4])(ttype);
    if ((char)iVar8 == '\0') {
      type_name_abi_cxx11_(&local_f8,local_130,ttype,false,false);
      plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,0x3a1f75);
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      plVar12 = plVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar12) {
        local_190.field_2._M_allocated_capacity = *plVar12;
        local_190.field_2._8_8_ = plVar9[3];
      }
      else {
        local_190.field_2._M_allocated_capacity = *plVar12;
        local_190._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_190._M_string_length = plVar9[1];
      *plVar9 = (long)plVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_190);
      local_1d8 = &local_1c8;
      plVar9 = puVar10 + 2;
      if ((long *)*puVar10 == plVar9) {
        local_1c8 = *plVar9;
        lStack_1c0 = puVar10[3];
      }
      else {
        local_1c8 = *plVar9;
        local_1d8 = (long *)*puVar10;
      }
      local_1d0 = puVar10[1];
      *puVar10 = plVar9;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
    }
    else {
      local_1d8 = &local_1c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"()","");
    }
    std::__cxx11::string::operator=((string *)&local_1b8,(string *)&local_1d8);
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8);
    }
    if ((char)iVar8 == '\0') {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
    }
    if (local_b8 != pptVar3) {
      std::__cxx11::string::_M_replace((ulong)&local_170,0,local_168,0x38316c);
    }
  }
  std::operator+(&local_50,"void ",local_120);
  plVar9 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_50,(ulong)(tfunction->name_)._M_dataplus._M_p);
  plVar12 = plVar9 + 2;
  if ((long *)*plVar9 == plVar12) {
    local_80 = *plVar12;
    lStack_78 = plVar9[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar12;
    local_90 = (long *)*plVar9;
  }
  local_88 = plVar9[1];
  *plVar9 = (long)plVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_90);
  plVar12 = plVar9 + 2;
  if ((long *)*plVar9 == plVar12) {
    local_60 = *plVar12;
    lStack_58 = plVar9[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar12;
    local_70 = (long *)*plVar9;
  }
  local_68 = plVar9[1];
  *plVar9 = (long)plVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_1b8);
  plVar12 = plVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)plVar12) {
    local_d8.field_2._M_allocated_capacity = *plVar12;
    local_d8.field_2._8_8_ = plVar9[3];
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  }
  else {
    local_d8.field_2._M_allocated_capacity = *plVar12;
    local_d8._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_d8._M_string_length = plVar9[1];
  *plVar9 = (long)plVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_d8);
  plVar12 = plVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)plVar12) {
    local_150.field_2._M_allocated_capacity = *plVar12;
    local_150.field_2._8_8_ = plVar9[3];
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  }
  else {
    local_150.field_2._M_allocated_capacity = *plVar12;
    local_150._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_150._M_string_length = plVar9[1];
  *plVar9 = (long)plVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_170);
  paVar1 = &local_118.field_2;
  puVar13 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar13) {
    local_118.field_2._M_allocated_capacity = *puVar13;
    local_118.field_2._8_8_ = puVar10[3];
    local_118._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_118.field_2._M_allocated_capacity = *puVar13;
    local_118._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_118._M_string_length = puVar10[1];
  *puVar10 = puVar13;
  puVar10[1] = 0;
  *(undefined1 *)(puVar10 + 2) = 0;
  argument_list_abi_cxx11_(&local_b0,local_130,local_128,local_194._0_1_,true);
  uVar16 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar1) {
    uVar16 = local_118.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar16 < local_b0._M_string_length + local_118._M_string_length) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      uVar16 = local_b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_b0._M_string_length + local_118._M_string_length) goto LAB_0019b886;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_b0,0,(char *)0x0,(ulong)local_118._M_dataplus._M_p);
  }
  else {
LAB_0019b886:
    puVar10 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_b0._M_dataplus._M_p);
  }
  local_1d8 = &local_1c8;
  plVar9 = puVar10 + 2;
  if ((long *)*puVar10 == plVar9) {
    local_1c8 = *plVar9;
    lStack_1c0 = puVar10[3];
  }
  else {
    local_1c8 = *plVar9;
    local_1d8 = (long *)*puVar10;
  }
  local_1d0 = puVar10[1];
  *puVar10 = plVar9;
  puVar10[1] = 0;
  *(undefined1 *)plVar9 = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_1d8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar11 = (size_type *)(plVar9 + 2);
  if ((size_type *)*plVar9 == psVar11) {
    lVar4 = plVar9[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar9;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
  }
  __return_storage_ptr__->_M_string_length = plVar9[1];
  *plVar9 = (long)psVar11;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar1) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170);
  }
  _Var17._M_p = (pointer)local_1b8;
  if (local_1b8 == &local_1a8) {
    return __return_storage_ptr__;
  }
LAB_0019ba01:
  operator_delete(_Var17._M_p);
  return __return_storage_ptr__;
}

Assistant:

string t_cpp_generator::function_signature(t_function* tfunction,
                                           string style,
                                           string prefix,
                                           bool name_params) {
  t_type* ttype = tfunction->get_returntype();
  t_struct* arglist = tfunction->get_arglist();
  bool has_xceptions = !tfunction->get_xceptions()->get_members().empty();

  if (style == "") {
    if (is_complex_type(ttype)) {
      return "void " + prefix + tfunction->get_name() + "(" + type_name(ttype)
             + (name_params ? "& _return" : "& /* _return */")
             + argument_list(arglist, name_params, true) + ")";
    } else {
      return type_name(ttype) + " " + prefix + tfunction->get_name() + "("
             + argument_list(arglist, name_params) + ")";
    }
  } else if (style.substr(0, 3) == "Cob") {
    string cob_type;
    string exn_cob;
    if (style == "CobCl") {
      cob_type = "(" + service_name_ + "CobClient";
      if (gen_templates_) {
        cob_type += "T<Protocol_>";
      }
      cob_type += "* client)";
    } else if (style == "CobSv") {
      cob_type = (ttype->is_void() ? "()" : ("(" + type_name(ttype) + " const& _return)"));
      if (has_xceptions) {
        exn_cob
            = ", ::std::function<void(::apache::thrift::TDelayedException* _throw)> /* exn_cob */";
      }
    } else {
      throw "UNKNOWN STYLE";
    }

    return "void " + prefix + tfunction->get_name() + "(::std::function<void" + cob_type + "> cob"
           + exn_cob + argument_list(arglist, name_params, true) + ")";
  } else {
    throw "UNKNOWN STYLE";
  }
}